

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<std::istream,short,unsigned_long>
               (IsoTree *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  uint8_t data_en;
  size_t data_sizets [4];
  double data_doubles [6];
  byte local_79;
  size_t local_78;
  size_t local_70;
  size_t sStack_68;
  size_t local_60;
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  double local_30;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>(&local_79,1,in);
    node->col_type = (uint)local_79;
    read_bytes<int,short>(&node->chosen_cat,1,in,buffer,diff_endian);
    read_bytes<double>(&local_58,6,in);
    if (diff_endian) {
      swap_endianness<double>(&local_58,6);
    }
    node->num_split = local_58;
    node->pct_tree_left = local_50;
    node->score = dStack_48;
    node->range_low = local_40;
    node->range_high = dStack_38;
    node->remainder = local_30;
    read_bytes<unsigned_long>(&local_78,4,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&local_78,4);
    }
    node->col_num = local_78;
    node->tree_left = local_70;
    node->tree_right = sStack_68;
    read_bytes<signed_char>(&node->cat_split,local_60,in);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int, saved_int_t>((void*)&node.chosen_cat, (size_t)1, in, buffer, diff_endian);

    double data_doubles[6];
    read_bytes<double, double>((void*)data_doubles, (size_t)6, in, buffer, diff_endian);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)4, in, buffer, diff_endian);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char, signed char>(node.cat_split, data_sizets[3], in, buffer, diff_endian);
}